

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# reflect_value_type_promotion.c
# Opt level: O0

value value_type_promotion_decimal(value v,type_id id)

{
  type_id id_00;
  int iVar1;
  type_id in_ESI;
  value in_RDI;
  type_id v_id;
  value promotion;
  anon_struct_16_2_94731ea7 decimal_promotion;
  value pvVar2;
  float local_28 [2];
  value in_stack_ffffffffffffffe0;
  value local_8;
  
  memset(local_28,0,0x10);
  pvVar2 = (value)0x0;
  id_00 = value_type_id(in_stack_ffffffffffffffe0);
  iVar1 = type_id_decimal(id_00);
  if (((iVar1 == 0) && (iVar1 = type_id_decimal(in_ESI), iVar1 == 0)) && (id_00 <= in_ESI)) {
    local_8 = in_RDI;
    if (id_00 != in_ESI) {
      local_28[0] = value_to_float(pvVar2);
      pvVar2 = value_create_double(6.06581685696903e-318);
      if (pvVar2 != (value)0x0) {
        value_destroy(pvVar2);
        local_8 = pvVar2;
      }
    }
  }
  else {
    local_8 = (value)0x0;
  }
  return local_8;
}

Assistant:

value value_type_promotion_decimal(value v, type_id id)
{
	struct
	{
		float f;
		double d;
	} decimal_promotion = {
		0.0f, 0.0
	};

	value promotion = NULL;

	type_id v_id = value_type_id(v);

	if (type_id_decimal(v_id) != 0 || type_id_decimal(id) != 0 || v_id > id)
	{
		return NULL;
	}

	if (v_id == id)
	{
		return v;
	}

	decimal_promotion.f = value_to_float(v);

	decimal_promotion.d = (double)decimal_promotion.f;

	promotion = value_create_double(decimal_promotion.d);

	if (promotion == NULL)
	{
		return v;
	}

	value_destroy(v);

	return promotion;
}